

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Annotation::GetTextXform
          (ON_OBSOLETE_V5_Annotation *this,ON_OBSOLETE_V5_RECT gdi_text_rect,int gdi_height_of_I,
          double dimstyle_textheight,double dimstyle_textgap,
          V5_TextDisplayMode dimstyle_textalignment,double dimscale,ON_3dVector cameraX,
          ON_3dVector cameraY,ON_Xform *model_xform,ON_Xform *xform)

{
  V5_eAnnotationType VVar1;
  int iVar2;
  ON_OBSOLETE_V5_DimAngular *pOVar3;
  ON_2dPoint *pOVar4;
  double dVar5;
  double xx;
  double yy;
  ON_2dVector OVar6;
  double local_c68;
  double local_c30;
  ON_Xform local_c10;
  ON_Xform local_b90;
  ON_Xform local_b10;
  ON_Xform local_a90;
  undefined1 local_a10 [8];
  ON_Xform gdi_to_world;
  double local_988;
  double local_980;
  ON_3dVector local_978;
  ON_3dVector local_960;
  undefined1 local_948 [8];
  ON_3dVector V_1;
  ON_2dVector R_2;
  ON_2dPoint E_1;
  ON_3dPoint fixed_point;
  ON_Xform horizonal_xform;
  ON_Xform plane_to_world;
  ON_Xform plane_translation;
  ON_OBSOLETE_V5_DimAngular *angular_dim_1;
  ON_OBSOLETE_V5_DimLinear *local_750;
  ON_OBSOLETE_V5_DimLinear *linear_dim;
  ON_2dVector text_offset_translation;
  undefined1 auStack_6b8 [8];
  ON_Xform text_centering_xform;
  undefined1 local_630 [8];
  ON_3dVector yr;
  ON_3dVector xr;
  ON_3dPoint pry;
  ON_3dPoint prx;
  ON_3dPoint p0;
  double local_5b0;
  undefined1 local_5a8 [8];
  ON_2dVector R_1;
  ON_2dPoint E;
  double local_580;
  ON_3dVector local_578;
  ON_3dVector local_560;
  undefined1 local_548 [8];
  ON_3dVector V;
  ON_2dVector R;
  double a;
  ON_OBSOLETE_V5_DimAngular *angular_dim;
  double local_508;
  double local_500;
  double local_4f8;
  ON_3dVector local_4f0;
  undefined1 local_4d8 [8];
  ON_Xform xfs;
  double y;
  double x;
  ON_2dVector text_centering_translation;
  ON_2dVector text_centering_rotation;
  undefined1 auStack_3a8 [8];
  ON_Xform flip;
  int local_31c;
  undefined1 local_318 [4];
  int position_style;
  undefined1 local_298 [8];
  ON_Xform plane_to_world_1;
  double text_line_width;
  ON_Xform gdi_to_plane;
  double gdi_to_plane_scale;
  ON_3dVector cameraZ;
  double textheight;
  V5_eAnnotationType ann_type;
  ON_OBSOLETE_V5_Annotation *ann;
  undefined1 local_d8 [8];
  ON_Xform mxi;
  ON_Xform *model_xform_local;
  double dimscale_local;
  V5_TextDisplayMode dimstyle_textalignment_local;
  double dimstyle_textgap_local;
  double dimstyle_textheight_local;
  int gdi_height_of_I_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  ON_OBSOLETE_V5_RECT gdi_text_rect_local;
  
  mxi.m_xform[3][3] = (double)model_xform;
  ON_Xform::ON_Xform((ON_Xform *)local_d8);
  if (mxi.m_xform[3][3] != 0.0) {
    ON_Xform::Inverse((ON_Xform *)&ann,(ON_Xform *)mxi.m_xform[3][3],(double *)0x0);
    memcpy(local_d8,&ann,0x80);
    ON_3dVector::Transform(&cameraX,(ON_Xform *)local_d8);
    ON_3dVector::Transform(&cameraY,(ON_Xform *)local_d8);
  }
  VVar1 = this->m_type;
  dimstyle_textheight_local._4_4_ = gdi_height_of_I;
  if (gdi_height_of_I == 0) {
    dimstyle_textheight_local._4_4_ = 0xa5;
  }
  model_xform_local = (ON_Xform *)dimscale;
  if ((dimscale == 0.0) && (!NAN(dimscale))) {
    model_xform_local = (ON_Xform *)0x3ff0000000000000;
  }
  local_c30 = (double)model_xform_local * dimstyle_textheight;
  local_c68 = (double)model_xform_local * dimstyle_textgap;
  if (VVar1 == dtTextBlock) {
    local_c30 = this->m_textheight * (double)model_xform_local;
  }
  cameraZ.z = local_c30;
  if ((local_c30 == 0.0) && (!NAN(local_c30))) {
    cameraZ.z = 1.0;
  }
  ON_CrossProduct((ON_3dVector *)&gdi_to_plane_scale,&cameraX,&cameraY);
  dVar5 = ON_3dVector::Length((ON_3dVector *)&gdi_to_plane_scale);
  if (1.490116119385e-08 < ABS(1.0 - dVar5)) {
    ON_3dVector::Unitize((ON_3dVector *)&gdi_to_plane_scale);
  }
  gdi_to_plane.m_xform[3][3] = cameraZ.z / (double)dimstyle_textheight_local._4_4_;
  memcpy(&text_line_width,&ON_Xform::IdentityTransformation,0x80);
  text_line_width = gdi_to_plane.m_xform[3][3];
  gdi_to_plane.m_xform[1][0] = -gdi_to_plane.m_xform[3][3];
  gdi_text_rect_local.left = gdi_text_rect.right;
  this_local._4_4_ = gdi_text_rect.left;
  plane_to_world_1.m_xform[3][3] =
       gdi_to_plane.m_xform[3][3] * (double)(gdi_text_rect_local.left - this_local._4_4_);
  if (VVar1 == dtTextBlock) {
    memcpy(local_298,&ON_Xform::IdentityTransformation,0x80);
    ON_Xform::Rotation((ON_Xform *)local_298,&ON_xy_plane,&this->m_plane);
    ON_Xform::operator*((ON_Xform *)local_318,(ON_Xform *)local_298,(ON_Xform *)&text_line_width);
    memcpy(xform,local_318,0x80);
  }
  else {
    local_31c = 0;
    switch(VVar1) {
    case dtNothing:
    case dtTextBlock:
      break;
    case dtDimLinear:
    case dtDimAligned:
    case dtDimAngular:
      local_31c = 1;
      break;
    case dtDimDiameter:
    case dtDimRadius:
    case dtDimOrdinate:
      local_31c = 2;
      break;
    case dtLeader:
      if (dimstyle_textalignment == kHorizontalToScreen) {
        local_31c = 1;
      }
      else {
        local_31c = 2;
      }
    }
    if ((dimstyle_textalignment != kHorizontalToScreen) || (local_31c == 1)) {
      if ((this->m_justification & 4) == 4) {
        gdi_to_plane.m_xform[0][2] = plane_to_world_1.m_xform[3][3] * 0.5;
      }
      else {
        gdi_to_plane.m_xform[0][2] = plane_to_world_1.m_xform[3][3] * -0.5;
      }
    }
    gdi_to_plane.m_xform[1][2] = cameraZ.z * -0.5;
    if ((dimstyle_textalignment != kHorizontalToScreen) &&
       (dVar5 = ON_3dVector::operator*((ON_3dVector *)&gdi_to_plane_scale,&(this->m_plane).zaxis),
       dVar5 < -1.490116119385e-08)) {
      flip.m_xform[3][1] = ON_Xform::IdentityTransformation.m_xform[3][2];
      flip.m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][3];
      flip.m_xform[2][3] = ON_Xform::IdentityTransformation.m_xform[3][0];
      flip.m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][1];
      flip.m_xform[2][1] = ON_Xform::IdentityTransformation.m_xform[2][2];
      flip.m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][3];
      flip.m_xform[1][3] = ON_Xform::IdentityTransformation.m_xform[2][0];
      flip.m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][1];
      flip.m_xform[1][1] = ON_Xform::IdentityTransformation.m_xform[1][2];
      flip.m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][3];
      flip.m_xform[0][3] = ON_Xform::IdentityTransformation.m_xform[1][0];
      flip.m_xform[1][0] = ON_Xform::IdentityTransformation.m_xform[1][1];
      flip.m_xform[0][1] = ON_Xform::IdentityTransformation.m_xform[0][2];
      flip.m_xform[0][2] = ON_Xform::IdentityTransformation.m_xform[0][3];
      auStack_3a8 = (undefined1  [8])ON_Xform::IdentityTransformation.m_xform[0][0];
      flip.m_xform[0][0] = ON_Xform::IdentityTransformation.m_xform[0][1];
      if (local_31c == 1) {
        auStack_3a8 = (undefined1  [8])0xbff0000000000000;
        flip.m_xform[0][2] = (double)(this_local._4_4_ + gdi_text_rect_local.left);
      }
      ON_Xform::operator*((ON_Xform *)&text_centering_rotation.y,(ON_Xform *)&text_line_width,
                          (ON_Xform *)auStack_3a8);
      memcpy(&text_line_width,&text_centering_rotation.y,0x80);
    }
    ON_2dVector::ON_2dVector((ON_2dVector *)&text_centering_translation.y,1.0,0.0);
    ON_2dVector::ON_2dVector((ON_2dVector *)&x,0.0,0.0);
    xfs.m_xform[3][3] = 1.0;
    memcpy(local_4d8,&ON_Xform::IdentityTransformation,0x80);
    if (dimstyle_textalignment == kHorizontalToScreen) {
      if (VVar1 == dtLeader) {
        if ((this->m_justification & 4) == 4) {
          ON_2dVector::Set((ON_2dVector *)&x,-(plane_to_world_1.m_xform[3][3] * 0.5 + local_c68),0.0
                          );
        }
        else if ((this->m_justification & 1) == 1) {
          ON_2dVector::Set((ON_2dVector *)&x,plane_to_world_1.m_xform[3][3] * 0.5 + local_c68,0.0);
        }
      }
    }
    else if ((VVar1 == dtDimLinear) || (VVar1 == dtDimAligned)) {
      if (dimstyle_textalignment == kAboveLine) {
        text_centering_translation.x = cameraZ.z * 0.5 + local_c68;
      }
      xfs.m_xform[3][3] = ON_3dVector::operator*(&(this->m_plane).yaxis,&cameraY);
      ON_3dVector::operator-(&local_4f0,&(this->m_plane).yaxis);
      dVar5 = ON_3dVector::operator*(&local_4f0,&cameraX);
      if ((ABS(xfs.m_xform[3][3]) <= 1.490116119385e-08) && (1.490116119385e-08 < ABS(dVar5))) {
        xfs.m_xform[3][3] = dVar5;
      }
      if (xfs.m_xform[3][3] < 0.0) {
        OVar6 = ON_2dVector::operator-((ON_2dVector *)&x);
        local_500 = OVar6.x;
        x = local_500;
        local_4f8 = OVar6.y;
        text_centering_translation.x = local_4f8;
        OVar6 = ON_2dVector::operator-((ON_2dVector *)&text_centering_translation.y);
        angular_dim = (ON_OBSOLETE_V5_DimAngular *)OVar6.x;
        text_centering_translation.y = (double)angular_dim;
        local_508 = OVar6.y;
        text_centering_rotation.x = local_508;
      }
    }
    else if (VVar1 == dtDimAngular) {
      pOVar3 = ON_OBSOLETE_V5_DimAngular::Cast((ON_Object *)this);
      if (pOVar3 != (ON_OBSOLETE_V5_DimAngular *)0x0) {
        dVar5 = pOVar3->m_angle * 0.5;
        xx = cos(dVar5);
        yy = sin(dVar5);
        ON_2dVector::ON_2dVector((ON_2dVector *)&V.z,xx,yy);
        text_centering_translation.y = cos(dVar5 - 1.5707963267948966);
        text_centering_rotation.x = sin(dVar5 - 1.5707963267948966);
        ::operator*(&local_560,V.z,&(this->m_plane).xaxis);
        ::operator*(&local_578,R.x,&(this->m_plane).yaxis);
        ON_3dVector::operator+((ON_3dVector *)local_548,&local_560,&local_578);
        dVar5 = ON_3dVector::operator*((ON_3dVector *)local_548,&cameraX);
        xfs.m_xform[3][3] = ON_3dVector::operator*((ON_3dVector *)local_548,&cameraY);
        if ((ABS(xfs.m_xform[3][3]) <= 1.490116119385e-08) && (1.490116119385e-08 < ABS(dVar5))) {
          xfs.m_xform[3][3] = -dVar5;
        }
        if (xfs.m_xform[3][3] < 0.0) {
          OVar6 = ON_2dVector::operator-((ON_2dVector *)&text_centering_translation.y);
          E.y = OVar6.x;
          text_centering_translation.y = E.y;
          local_580 = OVar6.y;
          text_centering_rotation.x = local_580;
        }
        if (dimstyle_textalignment == kAboveLine) {
          xfs.m_xform[3][3] = cameraZ.z * 0.5 + local_c68;
          x = -xfs.m_xform[3][3] * text_centering_rotation.x;
          text_centering_translation.x = xfs.m_xform[3][3] * text_centering_translation.y;
        }
      }
    }
    else if ((((VVar1 == dtDimDiameter) || (VVar1 == dtDimRadius)) || (VVar1 == dtLeader)) ||
            (VVar1 == dtDimOrdinate)) {
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&R_1.y,0.0,0.0);
      ON_2dVector::ON_2dVector((ON_2dVector *)local_5a8,1.0,0.0);
      GetLeaderEndAndDirection(this,(ON_2dPoint *)&R_1.y,(ON_2dVector *)local_5a8);
      text_centering_translation.y = (double)local_5a8;
      text_centering_rotation.x = R_1.x;
      OVar6 = ::operator*(plane_to_world_1.m_xform[3][3] * 0.5 + local_c68,
                          (ON_2dVector *)&text_centering_translation.y);
      p0.z = OVar6.x;
      x = p0.z;
      local_5b0 = OVar6.y;
      text_centering_translation.x = local_5b0;
      prx.z = (this->m_plane).origin.x;
      ON_Plane::PointAt((ON_3dPoint *)&pry.z,&this->m_plane,(double)local_5a8,R_1.x);
      ON_Plane::PointAt((ON_3dPoint *)&xr.z,&this->m_plane,-R_1.x,(double)local_5a8);
      ON_3dPoint::operator-((ON_3dVector *)&yr.z,(ON_3dPoint *)&pry.z,(ON_3dPoint *)&prx.z);
      ON_3dPoint::operator-((ON_3dVector *)local_630,(ON_3dPoint *)&xr.z,(ON_3dPoint *)&prx.z);
      dVar5 = ON_3dVector::operator*((ON_3dVector *)&yr.z,&cameraX);
      if (dVar5 <= 2.3283064365386963e-10) {
        local_4d8 = (undefined1  [8])0xbff0000000000000;
      }
      dVar5 = ON_3dVector::operator*((ON_3dVector *)local_630,&cameraY);
      if (dVar5 <= 2.3283064365386963e-10) {
        xfs.m_xform[1][0] = -1.0;
      }
    }
    text_centering_xform.m_xform[3][1] = ON_Xform::IdentityTransformation.m_xform[3][2];
    text_centering_xform.m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][3];
    text_centering_xform.m_xform[2][3] = ON_Xform::IdentityTransformation.m_xform[3][0];
    text_centering_xform.m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][1];
    text_centering_xform.m_xform[2][1] = ON_Xform::IdentityTransformation.m_xform[2][2];
    text_centering_xform.m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][3];
    text_centering_xform.m_xform[1][3] = ON_Xform::IdentityTransformation.m_xform[2][0];
    text_centering_xform.m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][1];
    text_centering_xform.m_xform[1][1] = ON_Xform::IdentityTransformation.m_xform[1][2];
    text_centering_xform.m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][3];
    text_centering_xform.m_xform[0][1] = ON_Xform::IdentityTransformation.m_xform[0][2];
    text_centering_xform.m_xform[0][2] = ON_Xform::IdentityTransformation.m_xform[0][3];
    auStack_6b8 = (undefined1  [8])text_centering_translation.y;
    text_centering_xform.m_xform[0][0] = -text_centering_rotation.x;
    text_centering_xform.m_xform[0][3] = text_centering_rotation.x;
    text_centering_xform.m_xform[1][0] = text_centering_translation.y;
    ON_Xform::operator*((ON_Xform *)&text_offset_translation.y,(ON_Xform *)auStack_6b8,
                        (ON_Xform *)local_4d8);
    auStack_6b8 = (undefined1  [8])text_offset_translation.y;
    text_centering_xform.m_xform[0][2] = x;
    text_centering_xform.m_xform[1][2] = text_centering_translation.x;
    ON_2dVector::ON_2dVector((ON_2dVector *)&linear_dim,0.0,0.0);
    switch(VVar1) {
    case dtNothing:
    case dtTextBlock:
      break;
    case dtDimLinear:
    case dtDimAligned:
      iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
      if ((4 < iVar2) &&
         (local_750 = ON_OBSOLETE_V5_DimLinear::Cast((ON_Object *)this),
         local_750 != (ON_OBSOLETE_V5_DimLinear *)0x0)) {
        _angular_dim_1 = ON_OBSOLETE_V5_DimLinear::Dim2dPoint(local_750,10000);
        ON_2dVector::operator=((ON_2dVector *)&linear_dim,(ON_2dPoint *)&angular_dim_1);
      }
      break;
    case dtDimAngular:
      iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
      if ((3 < iVar2) &&
         (pOVar3 = ON_OBSOLETE_V5_DimAngular::Cast((ON_Object *)this),
         pOVar3 != (ON_OBSOLETE_V5_DimAngular *)0x0)) {
        join_0x00001240_0x00001200_ = ON_OBSOLETE_V5_DimAngular::Dim2dPoint(pOVar3,10000);
        ON_2dVector::operator=
                  ((ON_2dVector *)&linear_dim,(ON_2dPoint *)(plane_translation.m_xform[3] + 3));
      }
      break;
    case dtDimDiameter:
    case dtDimRadius:
      iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
      if (3 < iVar2) {
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,2);
        ON_2dVector::operator=((ON_2dVector *)&linear_dim,pOVar4);
      }
      break;
    case dtLeader:
      iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
      if (0 < iVar2) {
        pOVar4 = ON_SimpleArray<ON_2dPoint>::Last
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
        ON_2dVector::operator=((ON_2dVector *)&linear_dim,pOVar4);
      }
      break;
    case dtDimOrdinate:
      iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
      if (iVar2 == 2) {
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,1);
        ON_2dVector::operator=((ON_2dVector *)&linear_dim,pOVar4);
      }
    }
    memcpy(plane_to_world.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
    plane_translation.m_xform[0][2] = (double)linear_dim;
    plane_translation.m_xform[1][2] = text_offset_translation.x;
    memcpy(horizonal_xform.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
    ON_Xform::Rotation((ON_Xform *)(horizonal_xform.m_xform[3] + 3),&ON_xy_plane,&this->m_plane);
    memcpy(&fixed_point.z,&ON_Xform::IdentityTransformation,0x80);
    if (dimstyle_textalignment == kHorizontalToScreen) {
      ON_Plane::PointAt((ON_3dPoint *)&E_1.y,&this->m_plane,(double)linear_dim,
                        text_offset_translation.x);
      ON_Xform::Rotation((ON_Xform *)&fixed_point.z,(ON_3dPoint *)&E_1.y,&(this->m_plane).xaxis,
                         &(this->m_plane).yaxis,&(this->m_plane).zaxis,(ON_3dPoint *)&E_1.y,&cameraX
                         ,&cameraY,(ON_3dVector *)&gdi_to_plane_scale);
      if (local_31c == 2) {
        ON_2dPoint::ON_2dPoint((ON_2dPoint *)&R_2.y,0.0,0.0);
        ON_2dVector::ON_2dVector((ON_2dVector *)&V_1.z,1.0,0.0);
        GetLeaderEndAndDirection(this,(ON_2dPoint *)&R_2.y,(ON_2dVector *)&V_1.z);
        ::operator*(&local_960,V_1.z,&(this->m_plane).xaxis);
        ::operator*(&local_978,R_2.x,&(this->m_plane).yaxis);
        ON_3dVector::operator+((ON_3dVector *)local_948,&local_960,&local_978);
        dVar5 = ON_3dVector::operator*((ON_3dVector *)local_948,&cameraX);
        if (dVar5 <= -1.490116119385e-08) {
          local_c68 = -(local_c68 + plane_to_world_1.m_xform[3][3]);
        }
        xfs.m_xform[3][3] = local_c68;
        ::operator*((ON_3dVector *)(gdi_to_world.m_xform[3] + 3),local_c68,&cameraX);
        local_948 = (undefined1  [8])gdi_to_world.m_xform[3][3];
        horizonal_xform.m_xform[0][2] = gdi_to_world.m_xform[3][3] + horizonal_xform.m_xform[0][2];
        horizonal_xform.m_xform[1][2] = local_988 + horizonal_xform.m_xform[1][2];
        horizonal_xform.m_xform[2][2] = local_980 + horizonal_xform.m_xform[2][2];
      }
    }
    ON_Xform::ON_Xform((ON_Xform *)local_a10);
    ON_Xform::operator*(&local_c10,(ON_Xform *)&fixed_point.z,
                        (ON_Xform *)(horizonal_xform.m_xform[3] + 3));
    ON_Xform::operator*(&local_b90,&local_c10,(ON_Xform *)(plane_to_world.m_xform[3] + 3));
    ON_Xform::operator*(&local_b10,&local_b90,(ON_Xform *)auStack_6b8);
    ON_Xform::operator*(&local_a90,&local_b10,(ON_Xform *)&text_line_width);
    memcpy(local_a10,&local_a90,0x80);
    memcpy(xform,local_a10,0x80);
  }
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::GetTextXform( 
      ON_OBSOLETE_V5_RECT gdi_text_rect,
      int gdi_height_of_I,
      double dimstyle_textheight,
      double dimstyle_textgap,
      ON_INTERNAL_OBSOLETE::V5_TextDisplayMode dimstyle_textalignment,
      double dimscale,
      ON_3dVector cameraX,
      ON_3dVector cameraY,
      const ON_Xform* model_xform,
      ON_Xform& xform
      ) const
{
  ON_Xform mxi;
  if( model_xform)
  {
    mxi = model_xform->Inverse();
    cameraX.Transform( mxi);
    cameraY.Transform( mxi);
  }
  const ON_OBSOLETE_V5_Annotation* ann = this;

  const ON_INTERNAL_OBSOLETE::V5_eAnnotationType ann_type = ann->m_type;

  if ( 0 == gdi_height_of_I )
  {
    // Default to height of Ariel 'I'
    gdi_height_of_I = (165*ON_Font::Constants::AnnotationFontCellHeight)/256;
  }

  if ( 0.0 == dimscale )
  {
    dimscale = 1.0;
  }

  dimstyle_textheight *= dimscale;
  dimstyle_textgap *= dimscale;

  double textheight = ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock == ann_type )
                    ? m_textheight*dimscale
                    : dimstyle_textheight;
  if ( 0.0 == textheight )
    textheight = 1.0;

  ON_3dVector cameraZ = ON_CrossProduct( cameraX, cameraY );
  if ( fabs( 1.0 - cameraZ.Length() ) > ON_SQRT_EPSILON )
  {
    cameraZ.Unitize();
  }

  // This xform is a scale from Windows gdi coordinates 
  // to annotation plane coordinates.
  const double gdi_to_plane_scale = textheight/gdi_height_of_I;
  ON_Xform gdi_to_plane(ON_Xform::IdentityTransformation);
  gdi_to_plane.m_xform[0][0] =  gdi_to_plane_scale;
  gdi_to_plane.m_xform[1][1] = -gdi_to_plane_scale;

  // width and height of text line in Rhino units.
  const double text_line_width  = gdi_to_plane_scale*(gdi_text_rect.right - gdi_text_rect.left);
  //const double text_line_height = gdi_to_plane_scale*(gdi_text_rect.bottom - gdi_text_rect.top);

  if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock == ann_type )
  {
    // The orientation of the text is text blocks
    // does not depend on the view or text alignment
    // settings.  The position and orientation of 
    // the text in every other annotation depends on
    // the view and text alignment settings.  
    //
    // It simplifies the code for the rest of the
    // annotation settings to quickly deal with text
    // blocks here.
    ON_Xform plane_to_world(ON_Xform::IdentityTransformation);
    plane_to_world.Rotation(ON_xy_plane,ann->m_plane);
    xform = plane_to_world*gdi_to_plane;
    return true;
  }

  // text_position_mode
  //   1 = linear, aligned, or anglular dimension
  //       (dimension definition determines center point of text box)
  //   2 = radial, diameter, leader
  //       (dimension definition determined end point of text box)
  int position_style = 0;
  switch( ann_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    // dimension definition determines center point of text box
    position_style = 1;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen == dimstyle_textalignment)
      position_style = 1;
    else
      position_style = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    // dimension definition determines end of text box
    position_style = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    break;
  }

  // This translation puts the center of the fist line of text at
  // (0,0) in the annotation's plane.
  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen != dimstyle_textalignment || 1 == position_style)
  {
    if((m_justification & tjRight) == tjRight)
      gdi_to_plane.m_xform[0][3] = 0.5*text_line_width;
    else
      gdi_to_plane.m_xform[0][3] = -0.5*text_line_width;
  }
  gdi_to_plane.m_xform[1][3] = -0.5*textheight;

  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen != dimstyle_textalignment)
  {
    if ( ((cameraZ*m_plane.zaxis) < -ON_SQRT_EPSILON) )
    {
      // Viewing dimension from the backside
      ON_Xform flip(ON_Xform::IdentityTransformation);
      switch ( position_style )
      {
      case 1: // ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular
        flip.m_xform[0][0] = -1.0;
        flip.m_xform[0][3] = gdi_text_rect.left + gdi_text_rect.right;
        break;

      case 2: // ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader
            //flip.m_xform[1][1] = -1.0;
            //flip.m_xform[1][3] = -(gdi_text_rect.top + gdi_text_rect.bottom);
        break;
      }
      gdi_to_plane = gdi_to_plane*flip;
    }
  }

  // text_centering_rotation rotates about the "center".  Angular,
  // radial, and leader dimensions use this rotation.
  ON_2dVector text_centering_rotation(1.0,0.0);

  // text_centering_translation is a small translation deals with
  // text that is above or to the right of the "center" point.  
  // It is no larger than dimstyle_gap + 1/2 the size of the
  // text's bounding box.
  ON_2dVector text_centering_translation(0.0,0.0);
  double x = 1.0, y = 1.0;
  ON_Xform xfs(ON_Xform::IdentityTransformation);

  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen != dimstyle_textalignment)
  {
    if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear  == ann_type || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned == ann_type )
    {
      if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine == dimstyle_textalignment)
      {
        text_centering_translation.y =  0.5*textheight+dimstyle_textgap;
      }
      y =  ann->m_plane.yaxis*cameraY;
      x = -ann->m_plane.yaxis*cameraX;
      if ( fabs(y) <= ON_SQRT_EPSILON && fabs(x) > ON_SQRT_EPSILON )
      {
        y = x;
      }
      if ( y < 0.0 )
      {
        text_centering_translation = -text_centering_translation;
        text_centering_rotation = -text_centering_rotation; // rotate 180 degrees
      }
    }
    else if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular == ann_type )
    {
      // This transform rotates the text in the annotation plane.
      const ON_OBSOLETE_V5_DimAngular* angular_dim = ON_OBSOLETE_V5_DimAngular::Cast(ann);
      if ( 0 != angular_dim )
      {
        double a = 0.5*angular_dim->m_angle;
        ON_2dVector R(cos(a),sin(a));
        a -= 0.5*ON_PI;
        text_centering_rotation.x = cos(a);
        text_centering_rotation.y = sin(a);
        ON_3dVector V = R.x*m_plane.xaxis + R.y*m_plane.yaxis;
        x = V*cameraX;
        y = V*cameraY;
        if ( fabs(y) <= ON_SQRT_EPSILON && fabs(x) > ON_SQRT_EPSILON )
        {
          y = -x;
        }
        if ( y < 0.0 )
        {
          text_centering_rotation = -text_centering_rotation; // add another 180 degrees of rotation
        }

        if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine == dimstyle_textalignment)
        {
          y = 0.5*textheight + dimstyle_textgap;
          text_centering_translation.x = -y*text_centering_rotation.y;
          text_centering_translation.y =  y*text_centering_rotation.x;
        }
      }
    }
    else if (    ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter == ann_type 
              || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius == ann_type 
              || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader == ann_type 
              || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate == ann_type)
    {
      // 30 Jan, 2015 - redid this again rh-29493, rh-29540
      ON_2dPoint E(0.0,0.0); // end point
      ON_2dVector R(1.0,0.0); // unit vector from penultimate point to end point
      GetLeaderEndAndDirection( this, E, R );
      text_centering_rotation = R;
      text_centering_translation = (dimstyle_textgap + 0.5*text_line_width)*text_centering_rotation;

      ON_3dPoint p0 = m_plane.origin;
      ON_3dPoint prx = m_plane.PointAt(R.x, R.y);
      ON_3dPoint pry = m_plane.PointAt(-R.y, R.x);

      ON_3dVector xr = prx - p0;  // 3d direction of text x
      ON_3dVector yr = pry - p0;  // 3d direction of text y

      if (xr * cameraX <= ON_ZERO_TOLERANCE)     // 22 April 2015 - Lowell - Fixed rh-30239
        xfs.m_xform[0][0] = -1.0;
      if (yr * cameraY <= ON_ZERO_TOLERANCE)
        xfs.m_xform[1][1] = -1.0;
    }
  }
  else if(ann_type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader)
  {
    if((m_justification & tjRight) == tjRight)
      text_centering_translation.Set(-(dimstyle_textgap + 0.5*text_line_width), 0.0);
    else if((m_justification & tjLeft) == tjLeft)
      text_centering_translation.Set(dimstyle_textgap + 0.5*text_line_width, 0.0);
  }

  ON_Xform text_centering_xform(ON_Xform::IdentityTransformation);
  text_centering_xform.m_xform[0][0] =  text_centering_rotation.x;
  text_centering_xform.m_xform[0][1] = -text_centering_rotation.y;
  text_centering_xform.m_xform[1][0] =  text_centering_rotation.y;
  text_centering_xform.m_xform[1][1] =  text_centering_rotation.x; 

  text_centering_xform = text_centering_xform * xfs;

  // Since the translation happens after the rotation about (0,0),
  // we can just tack it on here.
  text_centering_xform.m_xform[0][3] =  text_centering_translation.x;
  text_centering_xform.m_xform[1][3] =  text_centering_translation.y;

  // This transform translates the text in the annotation plane
  // from the plane origin to the final location of the annotation text
  // It can be a large translation
  ON_2dVector text_offset_translation(0.0,0.0); // CRhinoText::Offset() = text->Offset()
  switch( ann_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    if ( m_points.Count() >= ON_OBSOLETE_V5_DimLinear::dim_pt_count )
    {
      const ON_OBSOLETE_V5_DimLinear* linear_dim = ON_OBSOLETE_V5_DimLinear::Cast(ann);
      if ( linear_dim )
      {
        text_offset_translation = linear_dim->Dim2dPoint(ON_OBSOLETE_V5_DimLinear::text_pivot_pt);
      }
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    if ( m_points.Count() >= ON_OBSOLETE_V5_DimAngular::dim_pt_count )
    {
      const ON_OBSOLETE_V5_DimAngular* angular_dim = ON_OBSOLETE_V5_DimAngular::Cast(ann);
      if ( angular_dim )
      {
        text_offset_translation = angular_dim->Dim2dPoint(ON_OBSOLETE_V5_DimAngular::text_pivot_pt);
      }
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    if ( m_points.Count() >= ON_OBSOLETE_V5_DimRadial::dim_pt_count )
    {
      // No user positioned text on radial dimensions.
      text_offset_translation = m_points[ON_OBSOLETE_V5_DimRadial::tail_pt_index];
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    if ( m_points.Count() > 0 )
    {
      // No user positioned text on leaders.
      text_offset_translation = *m_points.Last();
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    if ( m_points.Count() == 2 )
    {
      // No user positioned text on leaders.
      text_offset_translation = m_points[1];
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    break;
  }

  ON_Xform plane_translation(ON_Xform::IdentityTransformation);
  plane_translation.m_xform[0][3] = text_offset_translation.x;
  plane_translation.m_xform[1][3] = text_offset_translation.y;

  // this transform maps a point in the annotation plane to world coordinates
  ON_Xform plane_to_world(ON_Xform::IdentityTransformation);
  plane_to_world.Rotation(ON_xy_plane,ann->m_plane);

  ON_Xform horizonal_xform(ON_Xform::IdentityTransformation);
  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen == dimstyle_textalignment)
  {
    ON_3dPoint fixed_point = ann->m_plane.PointAt(text_offset_translation.x,text_offset_translation.y);
    horizonal_xform.Rotation( 
        fixed_point,
        ann->m_plane.xaxis,
        ann->m_plane.yaxis,
        ann->m_plane.zaxis,
        fixed_point,
        cameraX,
        cameraY,
        cameraZ
        );

    if ( 2 == position_style )
    {
      // leaders, radial, and diameter
      ON_2dPoint E(0.0,0.0); // end point
      ON_2dVector R(1.0,0.0); // unit vector from penultimate point to end point
      GetLeaderEndAndDirection( this, E, R );
      ON_3dVector V = R.x*m_plane.xaxis + R.y*m_plane.yaxis;
      x = V*cameraX;
      y = ( x > -ON_SQRT_EPSILON )
        ? dimstyle_textgap
        : -(dimstyle_textgap + text_line_width);
      V = y*cameraX;
      horizonal_xform.m_xform[0][3] += V.x;
      horizonal_xform.m_xform[1][3] += V.y;
      horizonal_xform.m_xform[2][3] += V.z;
    }
  }

  ON_Xform gdi_to_world;

  gdi_to_world = horizonal_xform
               * plane_to_world
               * plane_translation
               * text_centering_xform
               * gdi_to_plane;

  xform = gdi_to_world;

  return true;
}